

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void fasttext::averageRowsFast<256u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  int iVar1;
  float *pfVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM1 [64];
  Register accum [16];
  undefined1 local_480 [1104];
  
  auVar12 = in_ZMM1._0_16_;
  auVar11 = in_ZMM0._0_16_;
  if (((ulong)(x->data_).mem_ & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 256U]"
                 );
  }
  pfVar2 = (matrix->data_).mem_;
  if (((ulong)pfVar2 & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb4,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 256U]"
                 );
  }
  piVar3 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar3 == piVar4) {
    Vector::zero(x);
    auVar11 = vcvtusi2sd_avx512f(auVar11,(long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(x,(float)(1.0 / auVar11._0_8_));
  }
  else {
    lVar6 = (matrix->super_Matrix).n_;
    memcpy(local_480,pfVar2 + *piVar3 * lVar6,0x400);
    piVar5 = piVar3;
    while (piVar5 = piVar5 + 1, piVar5 != piVar4) {
      iVar1 = *piVar5;
      lVar7 = 0;
      do {
        auVar8 = vaddps_avx512f(*(undefined1 (*) [64])(local_480 + lVar7),
                                *(undefined1 (*) [64])((long)pfVar2 + lVar7 + iVar1 * lVar6 * 4));
        *(undefined1 (*) [64])(local_480 + lVar7) = auVar8;
        lVar7 = lVar7 + 0x40;
      } while (lVar7 != 0x400);
    }
    auVar11 = vcvtusi2sd_avx512f(auVar12,(long)piVar4 - (long)piVar3 >> 2);
    dVar10 = 1.0 / auVar11._0_8_;
    auVar11._0_4_ = (float)dVar10;
    auVar11._4_4_ = (int)((ulong)dVar10 >> 0x20);
    auVar11._8_8_ = 0;
    auVar8 = vbroadcastss_avx512f(auVar11);
    lVar6 = 0;
    do {
      auVar9 = vmulps_avx512f(auVar8,*(undefined1 (*) [64])(local_480 + lVar6));
      *(undefined1 (*) [64])((long)(x->data_).mem_ + lVar6) = auVar9;
      lVar6 = lVar6 + 0x40;
    } while (lVar6 != 0x400);
  }
  return;
}

Assistant:

void averageRowsFast(Vector& x, const std::vector<int32_t>& rows, const DenseMatrix &matrix) {
  // Columns must be a multiple of how many floats fit in a register.
  static_assert(Cols % (sizeof(Register) / 4) == 0);
  constexpr unsigned RegisterCount = Cols / (sizeof(Register) / 4);
  // These should be aligned by aligned.h
  assert(reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0);
  assert(reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0);

  // Guard against empty list of rows with default NaN behavior.
  if (rows.empty()) {
    x.zero();
    x.mul(1.0 / rows.size());
    return;
  }

  // Copy the first row to accumulation registers.
  Register accum[RegisterCount];
  auto row = rows.cbegin();
  const Register *base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
  for (unsigned i = 0; i < RegisterCount; ++i) {
    accum[i] = base[i];
  }
  // Add the rows after the first.
  for (++row; row != rows.cend(); ++row) {
    base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
    for (unsigned i = 0; i < RegisterCount; ++i) {
      accum[i] = Add(accum[i], base[i]);
    }
  }
  // Multiply by (1.0 / rows.size()) and write to x.
  Register mul = Set1(1.0 / rows.size());
  for (unsigned i = 0; i < RegisterCount; ++i) {
    reinterpret_cast<Register*>(x.data())[i] = Multiply(accum[i], mul);
  }
}